

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall QTreeWidget::setHeaderItem(QTreeWidget *this,QTreeWidgetItem *item)

{
  int iVar1;
  QTreeWidgetPrivate *this_00;
  int iVar2;
  QTreeModel *pQVar3;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (item != (QTreeWidgetItem *)0x0) {
    this_00 = *(QTreeWidgetPrivate **)
               &(this->super_QTreeView).super_QAbstractItemView.super_QAbstractScrollArea.
                super_QFrame.super_QWidget.field_0x8;
    item->view = this;
    iVar2 = columnCount(this);
    iVar1 = (int)(item->values).d.size;
    if (iVar2 < iVar1) {
      pQVar3 = QTreeWidgetPrivate::treeModel(this_00);
      local_38 = 0xffffffffffffffff;
      local_30 = 0;
      uStack_28 = 0;
      QAbstractItemModel::beginInsertColumns((QModelIndex *)pQVar3,(int)&local_38,iVar2);
    }
    else if (iVar1 < iVar2) {
      pQVar3 = QTreeWidgetPrivate::treeModel(this_00);
      local_38 = 0xffffffffffffffff;
      local_30 = 0;
      uStack_28 = 0;
      QAbstractItemModel::beginRemoveColumns
                ((QModelIndex *)pQVar3,(int)&local_38,(int)(item->values).d.size);
    }
    pQVar3 = QTreeWidgetPrivate::treeModel(this_00);
    if (pQVar3->headerItem != (QTreeWidgetItem *)0x0) {
      (*pQVar3->headerItem->_vptr_QTreeWidgetItem[1])();
    }
    pQVar3 = QTreeWidgetPrivate::treeModel(this_00);
    pQVar3->headerItem = item;
    iVar1 = (int)(item->values).d.size;
    if (iVar2 < iVar1) {
      QTreeWidgetPrivate::treeModel(this_00);
      QAbstractItemModel::endInsertColumns();
    }
    else if (iVar1 < iVar2) {
      QTreeWidgetPrivate::treeModel(this_00);
      QAbstractItemModel::endRemoveColumns();
    }
    pQVar3 = QTreeWidgetPrivate::treeModel(this_00);
    QAbstractItemModel::headerDataChanged((Orientation)pQVar3,1,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidget::setHeaderItem(QTreeWidgetItem *item)
{
    Q_D(QTreeWidget);
    if (!item)
        return;
    item->view = this;

    int oldCount = columnCount();
    if (oldCount < item->columnCount())
         d->treeModel()->beginInsertColumns(QModelIndex(), oldCount, item->columnCount() - 1);
    else if (oldCount > item->columnCount())
         d->treeModel()->beginRemoveColumns(QModelIndex(), item->columnCount(), oldCount - 1);
    delete d->treeModel()->headerItem;
    d->treeModel()->headerItem = item;
    if (oldCount < item->columnCount())
        d->treeModel()->endInsertColumns();
    else if (oldCount > item->columnCount())
        d->treeModel()->endRemoveColumns();
    d->treeModel()->headerDataChanged(Qt::Horizontal, 0, oldCount);
}